

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O1

void __thiscall OpenMD::FragmentStamp::validate(FragmentStamp *this)

{
  pointer pcVar1;
  pointer piVar2;
  pointer ppRVar3;
  long lVar4;
  int iVar5;
  pointer *ppiVar6;
  ulong uVar7;
  vector<int,_std::allocator<int>_> members;
  vector<int,_std::allocator<int>_> local_68;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  DataHolder::validate(&this->super_DataHolder);
  if ((this->Name).super_ParameterBase.empty_ == false) {
    isNotEmpty();
    pcVar1 = (this->Name).data_._M_dataplus._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (this->Name).data_._M_string_length);
    lVar4 = local_40;
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    ppiVar6 = &local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    if ((pointer *)
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != ppiVar6) {
      operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (lVar4 == 0) {
      pcVar1 = (this->Name).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNotEmpty();
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppiVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,local_48,local_40 + (long)local_48);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,
               local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
      if ((pointer *)
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != ppiVar6) {
        operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      if (local_48 != local_38) {
        operator_delete(local_48,local_38[0] + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->atom2Rigidbody,
             (long)(this->atomStamps_).
                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->atomStamps_).
                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  piVar2 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar4 != 0) {
    iVar5 = -1;
    uVar7 = 0;
    do {
      piVar2[uVar7] = iVar5;
      uVar7 = uVar7 + 1;
      iVar5 = iVar5 + -1;
    } while ((uVar7 & 0xffffffff) < (ulong)(lVar4 >> 2));
  }
  ppRVar3 = (this->rigidBodyStamps_).
            super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->rigidBodyStamps_).
      super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppRVar3) {
    uVar7 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector(&local_68,&ppRVar3[(int)uVar7]->members_);
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        piVar2 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ppiVar6 = (pointer *)
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          piVar2[*(int *)ppiVar6] = (int)uVar7;
          ppiVar6 = (pointer *)((long)ppiVar6 + 4);
        } while (ppiVar6 !=
                 (pointer *)
                 local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if ((pointer *)
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0) {
        operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar7 = uVar7 + 1;
      ppRVar3 = (this->rigidBodyStamps_).
                super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->rigidBodyStamps_).
                                   super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar3 >> 3))
    ;
  }
  checkAtoms(this);
  checkBonds(this);
  fillBondInfo(this);
  checkBends(this);
  checkTorsions(this);
  checkInversions(this);
  checkRigidBodies(this);
  checkCutoffGroups(this);
  checkConstraints(this);
  checkNodes(this);
  return;
}

Assistant:

void FragmentStamp::validate() {
    DataHolder::validate();
    CheckParameter(Name, isNotEmpty());

    atom2Rigidbody.resize(getNAtoms());

    // A negative number means the atom is a free atom, and does not
    // belong to rigidbody. Every element in atom2Rigidbody has unique
    // negative number at the very beginning

    for (unsigned int i = 0; i < atom2Rigidbody.size(); ++i) {
      atom2Rigidbody[i] = -1 - int(i);
    }
    for (std::size_t i = 0; i < getNRigidBodies(); ++i) {
      RigidBodyStamp* rbStamp  = getRigidBodyStamp(i);
      std::vector<int> members = rbStamp->getMembers();
      for (std::vector<int>::iterator j = members.begin(); j != members.end();
           ++j) {
        atom2Rigidbody[*j] = i;
      }
    }
    checkAtoms();
    checkBonds();
    fillBondInfo();
    checkBends();
    checkTorsions();
    checkInversions();
    checkRigidBodies();
    checkCutoffGroups();
    checkConstraints();
    checkNodes();
  }